

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_forward_substitution(HTS_PStream *pst)

{
  double *pdVar1;
  size_t i;
  size_t t;
  HTS_PStream *pst_local;
  
  for (t = 0; t < pst->length; t = t + 1) {
    (pst->sm).g[t] = (pst->sm).wum[t];
    for (i = 1; i < pst->width && i <= t; i = i + 1) {
      pdVar1 = (pst->sm).g;
      pdVar1[t] = -(pst->sm).wuw[t - i][i] * (pst->sm).g[t - i] + pdVar1[t];
    }
  }
  return;
}

Assistant:

static void HTS_PStream_forward_substitution(HTS_PStream * pst)
{
   size_t t, i;

   for (t = 0; t < pst->length; t++) {
      pst->sm.g[t] = pst->sm.wum[t];
      for (i = 1; (i < pst->width) && (t >= i); i++)
         pst->sm.g[t] -= pst->sm.wuw[t - i][i] * pst->sm.g[t - i];
   }
}